

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

void __thiscall VGMPlayer::~VGMPlayer(VGMPlayer *this)

{
  undefined **ppuVar1;
  long lVar2;
  
  ppuVar1 = &PTR__VGMPlayer_001810b8;
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__VGMPlayer_001810b8;
  (this->super_PlayerBase)._eventCbFunc = (PLAYER_EVENT_CB)0x0;
  if ((this->_playState & 1) != 0) {
    Stop(this);
    ppuVar1 = (this->super_PlayerBase)._vptr_PlayerBase;
  }
  (*((_func_int **)ppuVar1)[6])(this);
  if (this->_cpcUTF16 != (CPCONV *)0x0) {
    CPConv_Deinit(this->_cpcUTF16);
  }
  lVar2 = 0x6938;
  do {
    PCM_BANK::~PCM_BANK((PCM_BANK *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != 0x5738);
  std::_Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::~_Vector_base
            (&(this->_dacStreams).
              super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_devNames);
  std::_Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::~_Vector_base
            (&(this->_devices).
              super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>);
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::~vector
            (&this->_devCfgs);
  lVar2 = 0x438;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 0x2d8);
  std::_Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::~_Vector_base
            (&(this->_xHdrChipVol).
              super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>);
  std::_Vector_base<VGMPlayer::XHDR_DATA32,_std::allocator<VGMPlayer::XHDR_DATA32>_>::~_Vector_base
            (&(this->_xHdrChipClk).
              super__Vector_base<VGMPlayer::XHDR_DATA32,_std::allocator<VGMPlayer::XHDR_DATA32>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_yrwRom).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  PlayerBase::~PlayerBase(&this->super_PlayerBase);
  return;
}

Assistant:

VGMPlayer::~VGMPlayer()
{
	_eventCbFunc = NULL;	// prevent any callbacks during destruction
	
	if (_playState & PLAYSTATE_PLAY)
		Stop();
	UnloadFile();
	
	if (_cpcUTF16 != NULL)
		CPConv_Deinit(_cpcUTF16);
	
	return;
}